

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDY_ZP_X(CPU *this)

{
  uint8_t uVar1;
  uint8_t data;
  CPU *this_local;
  
  this->cycles = 4;
  uVar1 = GetByte(this);
  this->cycles = this->cycles - 1;
  uVar1 = ReadByte(this,(ushort)(byte)(uVar1 + this->X));
  this->Y = uVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->Y == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->Y & 0x80) != 0 && -1 < (int)(this->Y & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDY_ZP_X()
{
    cycles = 4;
    uint8_t data = GetByte();
    data += X;
    cycles--;
    Y = ReadByte(data);
    Z = (Y == 0);
    N = (Y & 0b10000000) > 0;
}